

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactorisedJoin.cpp
# Opt level: O0

Union * __thiscall
FactorisedJoin::leapfroggingJoin
          (FactorisedJoin *this,DTreeNode *node,int *lower,int *upper,uint partition)

{
  value_type vVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  size_type sVar6;
  FactorisedJoin *pFVar7;
  reference pvVar8;
  reference pvVar9;
  pointer ppVar10;
  DTreeNode *pDVar11;
  reference pvVar12;
  reference ppdVar13;
  int *piVar14;
  Union *pUVar15;
  ulong uVar16;
  double *pdVar17;
  Union **ppUVar18;
  reference ppUVar19;
  _Node_iterator_base<std::pair<const_std::vector<double,_std::allocator<double>_>,_node::Union_*>,_true>
  this_00;
  unordered_map<std::vector<double,_std::allocator<double>_>,_node::Union_*,_std::hash<std::vector<double,_std::allocator<double>_>_>,_std::equal_to<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<const_std::vector<double,_std::allocator<double>_>,_node::Union_*>_>_>
  *in_RCX;
  long lVar20;
  DTreeNode *in_RDX;
  FactorisedJoin *in_RSI;
  long in_RDI;
  uint in_R8D;
  pair<std::__detail::_Node_iterator<std::pair<const_std::vector<double,_std::allocator<double>_>,_node::Union_*>,_false,_true>,_bool>
  pVar21;
  lock_guard<std::mutex> lock_1;
  size_t i_4;
  vector<double,_std::allocator<double>_> keyVals_1;
  size_t pointer;
  Union *unionNode;
  int numOfUnionValues;
  size_t k_1;
  int i_3;
  uint localCount;
  int i_2;
  DTreeNode *child;
  bool childEmpty;
  size_t k;
  bool atEnd;
  int numOfRel;
  int rel;
  int j;
  int i;
  uint count;
  double val;
  int *ordering;
  Union **localPointers;
  vector<node::Union_*,_std::allocator<node::Union_*>_> *unionPointers;
  vector<double,_std::allocator<double>_> *unionCounts;
  vector<double,_std::allocator<double>_> *unionValues;
  int *u;
  int *l;
  iterator it;
  lock_guard<std::mutex> lock;
  size_t i_1;
  vector<double,_std::allocator<double>_> keyVals;
  int childrenCount;
  double *varMap;
  bool caching;
  int_fast16_t nodeID;
  unordered_map<std::vector<double,_std::allocator<double>_>,_node::Union_*,_std::hash<std::vector<double,_std::allocator<double>_>_>,_std::equal_to<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<const_std::vector<double,_std::allocator<double>_>,_node::Union_*>_>_>
  *in_stack_fffffffffffffd78;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd80;
  undefined7 in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd8f;
  pair<const_std::vector<double,_std::allocator<double>_>,_node::Union_*> *in_stack_fffffffffffffd90
  ;
  size_type in_stack_fffffffffffffd98;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffda0;
  int **in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffde8;
  int *in_stack_fffffffffffffdf0;
  undefined7 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdff;
  DTreeNode *in_stack_fffffffffffffe00;
  _Node_iterator_base<std::pair<const_std::vector<double,_std::allocator<double>_>,_node::Union_*>,_true>
  in_stack_fffffffffffffe08;
  DTreeNode *in_stack_fffffffffffffe10;
  int *in_stack_fffffffffffffe18;
  FactorisedJoin *in_stack_fffffffffffffe20;
  double *in_stack_fffffffffffffe28;
  ulong local_188;
  vector<double,_std::allocator<double>_> local_170;
  ulong local_158;
  Union *local_150;
  int local_144;
  int *local_140;
  double local_138;
  int local_12c;
  uint local_128;
  int local_124;
  __node_base_ptr local_120;
  byte local_111;
  DTreeNode *local_110;
  byte local_105;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  uint local_f4;
  vector<double,_std::allocator<double>_> local_f0;
  vector<node::Union_*,_std::allocator<node::Union_*>_> *local_d8;
  vector<double,_std::allocator<double>_> *local_d0;
  vector<double,_std::allocator<double>_> *local_c8;
  void *local_c0;
  void *local_b8;
  uint local_ac;
  _Node_iterator_base<std::pair<const_std::vector<double,_std::allocator<double>_>,_node::Union_*>,_true>
  local_a8;
  _Node_iterator_base<std::pair<const_std::vector<double,_std::allocator<double>_>,_node::Union_*>,_true>
  local_a0 [2];
  FactorisedJoin *local_90;
  double local_70;
  vector<double,_std::allocator<double>_> local_68;
  int local_4c;
  DTreeNode *local_48;
  byte local_39;
  undefined4 in_stack_ffffffffffffffd0;
  unordered_map<std::vector<double,_std::allocator<double>_>,_node::Union_*,_std::hash<std::vector<double,_std::allocator<double>_>_>,_std::equal_to<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<const_std::vector<double,_std::allocator<double>_>,_node::Union_*>_>_>
  *puVar22;
  Union *local_8;
  
  lVar20 = (long)*(int *)&(in_RSI->_dataHandler).
                          super___shared_ptr<DataHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_39 = (in_RSI->_cacheMutex).super___mutex_base._M_mutex.__size[0x18] & 1;
  local_48 = *(DTreeNode **)(*(long *)(in_RDI + 0xa8) + (ulong)in_R8D * 0x40);
  local_4c = *(int *)&in_RSI->_ids;
  if (local_39 != 0) {
    sVar6 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)&in_RSI->_cacheMutex);
    in_stack_fffffffffffffe28 = (double *)(sVar6 + 1);
    local_70 = (double)lVar20;
    std::allocator<double>::allocator((allocator<double> *)0x1b8e5f);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (value_type_conflict3 *)in_stack_fffffffffffffd90,
               (allocator_type *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
    std::allocator<double>::~allocator((allocator<double> *)0x1b8e93);
    local_90 = (FactorisedJoin *)0x0;
    while (in_stack_fffffffffffffe20 = local_90,
          pFVar7 = (FactorisedJoin *)
                   std::vector<int,_std::allocator<int>_>::size
                             ((vector<int,_std::allocator<int>_> *)&in_RSI->_cacheMutex),
          in_stack_fffffffffffffe20 < pFVar7) {
      in_stack_fffffffffffffe10 = local_48;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&in_RSI->_cacheMutex,
                          (size_type)local_90);
      in_stack_fffffffffffffe18 =
           *(int **)(&(in_stack_fffffffffffffe10->_name)._M_dataplus + (long)*pvVar8 * 8);
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&local_68,(size_type)local_90);
      *pvVar9 = (value_type)in_stack_fffffffffffffe18;
      local_90 = (FactorisedJoin *)((long)&(local_90->super_Engine)._vptr_Engine + 1);
    }
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_fffffffffffffd80,
               (mutex_type *)in_stack_fffffffffffffd78);
    in_stack_fffffffffffffe08._M_cur =
         (__node_type *)
         std::
         unordered_map<std::vector<double,_std::allocator<double>_>,_node::Union_*,_std::hash<std::vector<double,_std::allocator<double>_>_>,_std::equal_to<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<const_std::vector<double,_std::allocator<double>_>,_node::Union_*>_>_>
         ::find(in_stack_fffffffffffffd78,(key_type *)0x1b8fae);
    local_a0[0]._M_cur = in_stack_fffffffffffffe08._M_cur;
    local_a8._M_cur =
         (__node_type *)
         std::
         unordered_map<std::vector<double,_std::allocator<double>_>,_node::Union_*,_std::hash<std::vector<double,_std::allocator<double>_>_>,_std::equal_to<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<const_std::vector<double,_std::allocator<double>_>,_node::Union_*>_>_>
         ::end(in_stack_fffffffffffffd78);
    bVar5 = std::__detail::operator!=(local_a0,&local_a8);
    if (bVar5) {
      ppVar10 = std::__detail::
                _Node_iterator<std::pair<const_std::vector<double,_std::allocator<double>_>,_node::Union_*>,_false,_true>
                ::operator->((_Node_iterator<std::pair<const_std::vector<double,_std::allocator<double>_>,_node::Union_*>,_false,_true>
                              *)0x1b9009);
      local_8 = ppVar10->second;
    }
    local_ac = (uint)bVar5;
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1b9073);
    std::vector<double,_std::allocator<double>_>::~vector(&in_stack_fffffffffffffd90->first);
    if (local_ac != 0) {
      return local_8;
    }
  }
  local_b8 = *(void **)(*(long *)(*(long *)(in_RDI + 0xa8) + (ulong)in_R8D * 0x40 + 8) + lVar20 * 8)
  ;
  memcpy(local_b8,in_RDX,dfdb::params::NUM_OF_TABLES << 2);
  local_c0 = *(void **)(*(long *)(*(long *)(in_RDI + 0xa8) + (ulong)in_R8D * 0x40 + 0x10) +
                       lVar20 * 8);
  memcpy(local_c0,in_RCX,dfdb::params::NUM_OF_TABLES << 2);
  local_c8 = (vector<double,_std::allocator<double>_> *)
             (*(long *)(*(long *)(in_RDI + 0xa8) + (ulong)in_R8D * 0x40 + 0x30) + lVar20 * 0x18);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x1b9198);
  local_d0 = (vector<double,_std::allocator<double>_> *)
             (*(long *)(*(long *)(in_RDI + 0xa8) + (ulong)in_R8D * 0x40 + 0x38) + lVar20 * 0x18);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x1b91da);
  local_d8 = (vector<node::Union_*,_std::allocator<node::Union_*>_> *)
             (*(long *)(*(long *)(in_RDI + 0xa8) + (ulong)in_R8D * 0x40 + 0x28) + lVar20 * 0x18);
  std::vector<node::Union_*,_std::allocator<node::Union_*>_>::clear
            ((vector<node::Union_*,_std::allocator<node::Union_*>_> *)0x1b921c);
  local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       *(pointer *)(*(long *)(*(long *)(in_RDI + 0xa8) + (ulong)in_R8D * 0x40 + 0x20) + lVar20 * 8);
  local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = *(pointer *)
               (*(long *)(*(long *)(in_RDI + 0xa8) + (ulong)in_R8D * 0x40 + 0x18) + lVar20 * 8);
  getRelationOrdering(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      (int *)in_stack_fffffffffffffe08._M_cur);
  local_f4 = 0;
  local_100 = 0;
  sVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                     (*(long *)(in_RDI + 0x30) + lVar20 * 0x18));
  local_104 = (int)sVar6;
  local_105 = 0;
  do {
    if (((local_105 ^ 0xff) & 1) == 0) {
LAB_001b9866:
      sVar6 = std::vector<double,_std::allocator<double>_>::size(local_c8);
      local_144 = (int)sVar6;
      if (local_144 == 0) {
        local_8 = (Union *)0x0;
      }
      else {
        pUVar15 = (Union *)operator_new(0x38);
        memset(pUVar15,0,0x38);
        pUVar15->numberOfValues = (long)local_144;
        *(long *)(in_RDI + 200) = (long)local_144 + *(long *)(in_RDI + 200);
        local_150 = pUVar15;
        if (local_4c == 0) {
          auVar2._8_8_ = 0;
          auVar2._0_8_ = (long)local_144;
          uVar16 = SUB168(auVar2 * ZEXT816(8),0);
          if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
            uVar16 = 0xffffffffffffffff;
          }
          pdVar17 = (double *)operator_new__(uVar16);
          local_150->values = pdVar17;
          pdVar17 = local_150->values;
          pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](local_c8,0);
          memcpy(pdVar17,pvVar9,(long)local_144 << 3);
        }
        else {
          auVar3._8_8_ = 0;
          auVar3._0_8_ = (long)(local_144 << 1);
          uVar16 = SUB168(auVar3 * ZEXT816(8),0);
          if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
            uVar16 = 0xffffffffffffffff;
          }
          pdVar17 = (double *)operator_new__(uVar16);
          local_150->values = pdVar17;
          pdVar17 = local_150->values;
          pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](local_c8,0);
          memcpy(pdVar17,pvVar9,(long)local_144 << 3);
          pdVar17 = local_150->values;
          lVar20 = (long)local_144;
          pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](local_d0,0);
          memcpy(pdVar17 + lVar20,pvVar9,(long)local_144 << 3);
        }
        auVar4._8_8_ = 0;
        auVar4._0_8_ = (long)(local_144 * local_4c);
        uVar16 = SUB168(auVar4 * ZEXT816(8),0);
        if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
          uVar16 = 0xffffffffffffffff;
        }
        ppUVar18 = (Union **)operator_new__(uVar16);
        local_150->children = ppUVar18;
        for (local_158 = 0; uVar16 = local_158,
            sVar6 = std::vector<node::Union_*,_std::allocator<node::Union_*>_>::size(local_d8),
            uVar16 < sVar6; local_158 = local_158 + 1) {
          ppUVar19 = std::vector<node::Union_*,_std::allocator<node::Union_*>_>::operator[]
                               (local_d8,local_158);
          local_150->children[local_158] = *ppUVar19;
        }
        local_150->count = local_f4;
        if ((local_39 & 1) != 0) {
          std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)&in_RSI->_cacheMutex);
          std::allocator<double>::allocator((allocator<double> *)0x1b9b47);
          std::vector<double,_std::allocator<double>_>::vector
                    (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                     (value_type_conflict3 *)in_stack_fffffffffffffd90,
                     (allocator_type *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88)
                    );
          std::allocator<double>::~allocator((allocator<double> *)0x1b9b75);
          for (local_188 = 0;
              sVar6 = std::vector<int,_std::allocator<int>_>::size
                                ((vector<int,_std::allocator<int>_> *)&in_RSI->_cacheMutex),
              local_188 < sVar6; local_188 = local_188 + 1) {
            pDVar11 = local_48;
            pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)&in_RSI->_cacheMutex,local_188)
            ;
            vVar1 = *(value_type *)(&(pDVar11->_name)._M_dataplus + (long)*pvVar8 * 8);
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](&local_170,local_188);
            *pvVar9 = vVar1;
          }
          std::lock_guard<std::mutex>::lock_guard
                    ((lock_guard<std::mutex> *)in_stack_fffffffffffffd80,
                     (mutex_type *)in_stack_fffffffffffffd78);
          local_150->cacheIndex = *(unsigned_short *)(in_RDI + 0xb8);
          *(int *)(in_RDI + 0xb8) = *(int *)(in_RDI + 0xb8) + 1;
          std::pair<const_std::vector<double,_std::allocator<double>_>,_node::Union_*>::
          pair<std::vector<double,_std::allocator<double>_>_&,_node::Union_*&,_true>
                    (in_stack_fffffffffffffd90,
                     (vector<double,_std::allocator<double>_> *)
                     CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
                     (Union **)in_stack_fffffffffffffd80);
          pVar21 = std::
                   unordered_map<std::vector<double,_std::allocator<double>_>,_node::Union_*,_std::hash<std::vector<double,_std::allocator<double>_>_>,_std::equal_to<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<const_std::vector<double,_std::allocator<double>_>,_node::Union_*>_>_>
                   ::insert((unordered_map<std::vector<double,_std::allocator<double>_>,_node::Union_*,_std::hash<std::vector<double,_std::allocator<double>_>_>,_std::equal_to<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<const_std::vector<double,_std::allocator<double>_>,_node::Union_*>_>_>
                             *)in_stack_fffffffffffffd90,
                            (value_type *)
                            CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
          this_00._M_cur =
               (__node_type *)
               pVar21.first.
               super__Node_iterator_base<std::pair<const_std::vector<double,_std::allocator<double>_>,_node::Union_*>,_true>
               ._M_cur;
          std::pair<const_std::vector<double,_std::allocator<double>_>,_node::Union_*>::~pair
                    ((pair<const_std::vector<double,_std::allocator<double>_>,_node::Union_*> *)
                     0x1b9cf8);
          std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1b9d05);
          std::vector<double,_std::allocator<double>_>::~vector
                    ((vector<double,_std::allocator<double>_> *)this_00._M_cur);
        }
        local_8 = local_150;
      }
      return local_8;
    }
    in_stack_fffffffffffffd80 = &local_f0;
    puVar22 = in_RCX;
    local_105 = seekValue((FactorisedJoin *)in_stack_fffffffffffffe08._M_cur,
                          in_stack_fffffffffffffe00,
                          (int *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                          in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                          in_stack_fffffffffffffde0,(int *)in_stack_fffffffffffffe20,
                          in_stack_fffffffffffffe28);
    in_stack_fffffffffffffd78 = in_RCX;
    if ((bool)local_105) goto LAB_001b9866;
    local_110 = (DTreeNode *)0x0;
    in_RCX = puVar22;
    while (in_stack_fffffffffffffe00 = local_110,
          pDVar11 = (DTreeNode *)
                    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *
                               )(*(long *)(in_RDI + 0x30) + lVar20 * 0x18)),
          in_stack_fffffffffffffe00 < pDVar11) {
      pvVar12 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                          ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                           (*(long *)(in_RDI + 0x30) +
                           (long)*(int *)&(in_RSI->_dataHandler).
                                          super___shared_ptr<DataHandler,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr * 0x18),(size_type)local_110);
      local_f8 = pvVar12->first;
      pvVar12 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                          ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                           (*(long *)(in_RDI + 0x30) +
                           (long)*(int *)&(in_RSI->_dataHandler).
                                          super___shared_ptr<DataHandler,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr * 0x18),(size_type)local_110);
      local_fc = pvVar12->second;
      *(undefined4 *)((long)local_c0 + (long)local_f8 * 4) =
           *(undefined4 *)((long)local_b8 + (long)local_f8 * 4);
      while( true ) {
        bVar5 = false;
        if (*(int *)((long)local_c0 + (long)local_f8 * 4) <
            *(int *)((long)&(in_RCX->_M_h)._M_buckets + (long)local_f8 * 4)) {
          ppdVar13 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                               ((vector<double_*,_std::allocator<double_*>_> *)
                                (*(long *)(in_RDI + 0x18) + (long)local_f8 * 0x18),
                                (long)(*(int *)((long)local_c0 + (long)local_f8 * 4) + 1));
          bVar5 = (*ppdVar13)[local_fc] ==
                  (double)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
        }
        if (!bVar5) break;
        *(int *)((long)local_c0 + (long)local_f8 * 4) =
             *(int *)((long)local_c0 + (long)local_f8 * 4) + 1;
      }
      local_110 = (DTreeNode *)&(local_110->_name).field_0x1;
      in_stack_fffffffffffffdff = 0;
    }
    if (local_4c < 1) {
      std::vector<double,_std::allocator<double>_>::push_back
                (&in_stack_fffffffffffffd90->first,
                 (value_type_conflict3 *)
                 CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
      local_f4 = local_f4 + 1;
    }
    else {
      local_111 = 0;
      *(pointer *)(&(local_48->_name)._M_dataplus + lVar20 * 8) =
           local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_120 = (__node_base_ptr)(in_RSI->_caches)._M_h._M_buckets;
      for (local_124 = 0; local_124 < local_4c; local_124 = local_124 + 1) {
        pUVar15 = leapfroggingJoin(in_RSI,in_RDX,(int *)in_RCX,
                                   (int *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
                                   (uint)((ulong)lVar20 >> 0x20));
        local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage[local_124] = (double)pUVar15;
        if (local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage[local_124] == 0.0) {
          local_111 = 1;
          break;
        }
        local_120 = local_120[9]._M_nxt;
      }
      if ((local_111 & 1) == 0) {
        std::vector<double,_std::allocator<double>_>::push_back
                  (&in_stack_fffffffffffffd90->first,
                   (value_type_conflict3 *)
                   CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
        local_128 = 1;
        for (local_12c = 0; local_12c < local_4c; local_12c = local_12c + 1) {
          std::vector<node::Union_*,_std::allocator<node::Union_*>_>::push_back
                    ((vector<node::Union_*,_std::allocator<node::Union_*>_> *)
                     in_stack_fffffffffffffd90,
                     (value_type *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
          local_128 = *(int *)((long)local_f0.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage[local_12c] +
                              0x1c) * local_128;
        }
        local_f4 = local_f4 + local_128;
        local_138 = (double)local_128;
        std::vector<double,_std::allocator<double>_>::push_back
                  (in_stack_fffffffffffffd80,(value_type_conflict3 *)in_stack_fffffffffffffd78);
      }
    }
    local_140 = (int *)0x0;
    while (in_stack_fffffffffffffdf0 = local_140,
          piVar14 = (int *)std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                           size((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 *)(*(long *)(in_RDI + 0x30) + lVar20 * 0x18)),
          in_stack_fffffffffffffdf0 < piVar14) {
      pvVar12 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                          ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                           (*(long *)(in_RDI + 0x30) + lVar20 * 0x18),(size_type)local_140);
      local_f8 = pvVar12->first;
      *(undefined4 *)((long)local_b8 + (long)local_f8 * 4) =
           *(undefined4 *)((long)local_c0 + (long)local_f8 * 4);
      local_140 = (int *)((long)local_140 + 1);
    }
    pvVar12 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                        ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         (*(long *)(in_RDI + 0x30) + lVar20 * 0x18),
                         (long)*(int *)((long)local_f0.
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_finish +
                                       (long)local_100 * 4));
    local_f8 = pvVar12->first;
    *(int *)((long)local_b8 + (long)local_f8 * 4) =
         *(int *)((long)local_b8 + (long)local_f8 * 4) + 1;
    if (*(int *)((long)&(in_RCX->_M_h)._M_buckets + (long)local_f8 * 4) <
        *(int *)((long)local_b8 + (long)local_f8 * 4)) {
      local_105 = 1;
      goto LAB_001b9866;
    }
    local_100 = (local_100 + 1) % local_104;
  } while( true );
}

Assistant:

Union* FactorisedJoin::leapfroggingJoin(
    DTreeNode* node, int* lower, int* upper, unsigned int partition)
{
    int_fast16_t nodeID = node->_id;
    bool caching = node->_caching;
    double* varMap = _partitionFields[partition].varMap;
    int childrenCount = node->_numOfChildren;

    /* If this node allows for caching we check if the aggregate array has been
     * cached already. */
    if (caching)
    {
        /* 
         * We initialise the elements in the vector to nodeID instead of 
         * default-initialising them. The last element will not be overwritten. 
         */
        vector<double> keyVals(node->_key.size() + 1, nodeID);
        for (size_t i = 0; i < node->_key.size(); ++i)
            keyVals[i] = varMap[node->_key[i]];

        lock_guard<mutex> lock(_cacheMutex);
		
        auto it = _caches.find(keyVals);
        if (it != _caches.end())
        {
            return it->second;			// Return pointer to cached union node.
        }
    }

    /* lower range pointer for each relation. */
    int* l = _partitionFields[partition].LOWERBOUND[nodeID];
    memcpy(l, lower, sizeof(int) * NUM_OF_TABLES);

    /* upper range pointer for each relation. */
    int* u = _partitionFields[partition].UPPERBOUND[nodeID];
    memcpy(u, upper, sizeof(int) * NUM_OF_TABLES);

    vector<double>& unionValues = _partitionFields[partition].values[nodeID];
    unionValues.clear();

    vector<double>& unionCounts = _partitionFields[partition].localCount[nodeID];
    unionCounts.clear();

    vector<Union*>& unionPointers = _partitionFields[partition].pointers[nodeID];
    unionPointers.clear();

    Union** localPointers = _partitionFields[partition].localPointerPlaceholder[nodeID];

    int* ordering = _partitionFields[partition].ordering[nodeID];

    /* Provides order of Relations from min -> max. */
    getRelationOrdering(l, node, ordering);

    /* Value that satisfies the join query - set in seekValue. */
    double val;
    unsigned int count = 0; 

    /* Indexes used by the join algorithm. */
    int i, j, rel = 0, numOfRel = _ids[nodeID].size();
    bool atEnd = false;
    while (!atEnd)
    {
        /* seek the value that satisfies the join query */
        atEnd = seekValue(node, rel, ordering, numOfRel, l, upper, val);

        if (atEnd)
            break;

        /* Get range of tuples with value equal to val. */
        for (size_t k = 0; k < _ids[nodeID].size(); ++k)
        {
            i = _ids[node->_id][k].first;
            j = _ids[node->_id][k].second;
            u[i] = l[i];

            // TODO: This could be optimized and perhaps added to seek value
            while (u[i] < upper[i] && _data[i][u[i] + 1][j] == val)
            {
                ++u[i];
            }
        }

        /*
         * Below the aggregates are updated based on the value that
         * satisfied the join query.
         */
        if (childrenCount > 0)
        {
            bool childEmpty = false;

            /* 
             * Update the varMap which keeps track of the values that satisfy the 
             * join query above this node 
             */
            varMap[nodeID] = val;

            DTreeNode* child = node->_firstChild;
            for (int i = 0; i < childrenCount; ++i)
            {
                /* Call join algorithm for each child */
                localPointers[i] = leapfroggingJoin(child, l, u, partition);

                /*
                 * If the first aggregate for child is zero then count = 0
                 * and the join query is not satisfied for this value. 
                 */ 
                if (localPointers[i] == nullptr)
                {
                    childEmpty = true;
                    break;
                }

                child = child->_next;
            }

            /* if no child is empty we update the aggregates */
            if (!childEmpty)
            {
                /* Push back the value from this node */ 
                unionValues.push_back(val);

                unsigned int localCount = 1;
                for (int i = 0; i < childrenCount; ++i)
                {
                    unionPointers.push_back(localPointers[i]);
                    localCount *= localPointers[i] -> count; 
                }

                count += localCount;
                unionCounts.push_back(localCount);
            }
        }
        /* Case for leaf nodes */
        else
        {
            /* Push back the value from this node */ 
            unionValues.push_back(val);
            ++count;
        }

        for (size_t k = 0; k < _ids[nodeID].size(); ++k)
        {
            i = _ids[nodeID][k].first;
            l[i] = u[i];
        }

        i = _ids[nodeID][ordering[rel]].first;
        l[i] += 1;

        if (l[i] > upper[i])
        {
            atEnd = true;
            break;
        }
        else
        {
            rel = (rel + 1) % numOfRel;
        }
    }

    int numOfUnionValues = unionValues.size(); 
    /*
     * If unionValues.size() == 0 it means that no value for this node
     * has satisfied the join query, so the union is empty.
     */
    if (numOfUnionValues == 0) 
    {
        // delete unionNode; 
        return nullptr;
    }

    /* If there are values in the union we construct the union */
    Union* unionNode = new Union();
    unionNode->numberOfValues = numOfUnionValues;

    numberOfValues += numOfUnionValues; 

    if (childrenCount == 0)
    {
        /* Initialise values array */
        unionNode->values = new double[numOfUnionValues];
		
        /* Copy values into array */
        memcpy(unionNode->values, &unionValues[0],
               numOfUnionValues*sizeof(double));
    }
    else
    {
        /* Initialise values array */
        unionNode->values = new double[numOfUnionValues * 2];
		
        /* Copy values into array */
        memcpy(unionNode->values, &unionValues[0],
               numOfUnionValues*sizeof(double));

        /* Copy values into array */
        memcpy(unionNode->values+numOfUnionValues, &unionCounts[0],
               numOfUnionValues*sizeof(double));
    }

    assert( (size_t) numOfUnionValues * childrenCount == unionPointers.size());

    /* Initialise pointer array */
    unionNode->children = new Union*[numOfUnionValues * childrenCount];

    /* Copy pointer into array */
    for (size_t pointer = 0; pointer < unionPointers.size(); ++pointer)
        unionNode->children[pointer] = unionPointers[pointer];

    unionNode -> count = count; 
	
    /* If we get here and caching is allowed it means that we need to add
     * aggregates to cache. */
    if (caching)
    {
        /*
         * We initialise the elements in the vector to nodeID instead of
         * default-initialising them.  The last element will not be overwritten.
         */
        vector<double> keyVals(node->_key.size() + 1, nodeID);
        for (size_t i = 0; i < node->_key.size(); ++i)
            keyVals[i] = varMap[node->_key[i]];

        /* Lock the _caches map so we can savely insert our newly cached values */
        lock_guard<mutex> lock(_cacheMutex);
        unionNode->cacheIndex = numberOfCachedValues;
        ++numberOfCachedValues;
        _caches.insert({ keyVals, unionNode });
    }

    return unionNode; 
}